

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

bootstrap_analysis *
Catch::Benchmark::Detail::analyse_samples
          (bootstrap_analysis *__return_storage_ptr__,double confidence_level,uint n_resamples,
          double *first,double *last)

{
  double dVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double sb;
  Estimate<double> stddev_estimate;
  Estimate<double> mean_estimate;
  anon_class_32_4_6f2d8bc5 Estimate;
  Estimate<double> local_b0;
  Estimate<double> local_90;
  anon_class_32_4_6f2d8bc5 local_70;
  anon_class_32_4_9b8c116d local_50;
  
  local_70.n_resamples = n_resamples;
  local_70.first = first;
  local_70.last = last;
  local_70.confidence_level = confidence_level;
  analyse_samples::anon_class_32_4_6f2d8bc5::operator()(&local_90,&local_70,mean);
  analyse_samples::anon_class_32_4_6f2d8bc5::operator()
            (&local_b0,&local_70,anon_unknown_7::standard_deviation);
  dVar7 = local_b0.point;
  local_50.n = (int)((ulong)((long)last - (long)first) >> 3);
  dVar9 = (double)local_50.n;
  local_50.mn = local_90.point / dVar9;
  dVar4 = local_50.mn * 0.5;
  dVar10 = dVar4 * 0.25;
  if (dVar9 < 0.0) {
    dVar1 = sqrt(dVar9);
  }
  else {
    dVar1 = SQRT(dVar9);
  }
  dVar8 = dVar7 / dVar1;
  if (dVar10 <= dVar7 / dVar1) {
    dVar8 = dVar10;
  }
  dVar7 = dVar7 * dVar7;
  dVar8 = dVar8 * dVar8;
  local_50.sb2 = dVar7;
  local_50.sg2 = dVar8;
  dVar10 = anon_unknown_7::outlier_variance::anon_class_32_4_9b8c116d::operator()(&local_50,0.0);
  dVar4 = anon_unknown_7::outlier_variance::anon_class_32_4_9b8c116d::operator()(&local_50,dVar4);
  uVar2 = SUB84(dVar4,0);
  uVar3 = (undefined4)((ulong)dVar4 >> 0x20);
  if (dVar10 <= dVar4) {
    uVar2 = SUB84(dVar10,0);
    uVar3 = (undefined4)((ulong)dVar10 >> 0x20);
  }
  auVar5._0_8_ = dVar9 - (double)CONCAT44(uVar3,uVar2);
  auVar5._8_8_ = dVar9 + -1.0;
  auVar6._8_8_ = dVar9;
  auVar6._0_8_ = dVar9;
  auVar6 = divpd(auVar5,auVar6);
  dVar4 = (dVar7 - dVar8 * auVar5._0_8_) * auVar6._0_8_;
  dVar9 = (dVar7 - dVar8 * (dVar9 + -1.0)) * auVar6._8_8_;
  if (dVar9 <= dVar4) {
    dVar4 = dVar9;
  }
  (__return_storage_ptr__->mean).upper_bound = local_90.upper_bound;
  (__return_storage_ptr__->mean).confidence_interval = local_90.confidence_interval;
  (__return_storage_ptr__->mean).point = local_90.point;
  (__return_storage_ptr__->mean).lower_bound = local_90.lower_bound;
  (__return_storage_ptr__->standard_deviation).upper_bound = local_b0.upper_bound;
  (__return_storage_ptr__->standard_deviation).confidence_interval = local_b0.confidence_interval;
  (__return_storage_ptr__->standard_deviation).point = local_b0.point;
  (__return_storage_ptr__->standard_deviation).lower_bound = local_b0.lower_bound;
  __return_storage_ptr__->outlier_variance = dVar4 / dVar7;
  return __return_storage_ptr__;
}

Assistant:

bootstrap_analysis analyse_samples(double confidence_level,
                                               unsigned int n_resamples,
                                               double* first,
                                               double* last) {
                auto mean = &Detail::mean;
                auto stddev = &standard_deviation;

#if defined(CATCH_CONFIG_USE_ASYNC)
                auto Estimate = [=](double(*f)(double const*, double const*)) {
                    std::random_device rd;
                    auto seed = rd();
                    return std::async(std::launch::async, [=] {
                        SimplePcg32 rng( seed );
                        auto resampled = resample(rng, n_resamples, first, last, f);
                        return bootstrap(confidence_level, first, last, resampled, f);
                    });
                };

                auto mean_future = Estimate(mean);
                auto stddev_future = Estimate(stddev);

                auto mean_estimate = mean_future.get();
                auto stddev_estimate = stddev_future.get();
#else
                auto Estimate = [=](double(*f)(double const* , double const*)) {
                    std::random_device rd;
                    auto seed = rd();
                    SimplePcg32 rng( seed );
                    auto resampled = resample(rng, n_resamples, first, last, f);
                    return bootstrap(confidence_level, first, last, resampled, f);
                };

                auto mean_estimate = Estimate(mean);
                auto stddev_estimate = Estimate(stddev);
#endif // CATCH_USE_ASYNC

                auto n = static_cast<int>(last - first); // seriously, one can't use integral types without hell in C++
                double outlier_variance = Detail::outlier_variance(mean_estimate, stddev_estimate, n);

                return { mean_estimate, stddev_estimate, outlier_variance };
            }